

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall
FormatterTest_RuntimePrecision_Test::TestBody(FormatterTest_RuntimePrecision_Test *this)

{
  bool bVar1;
  size_t sVar2;
  int *in_RCX;
  int *piVar3;
  uint *args_1;
  long *plVar4;
  unsigned_long *args_1_00;
  double *args_1_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  char *pcVar5;
  undefined1 local_558 [8];
  ushort uStack_550;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  undefined1 local_50c [36];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  char format_str [256];
  
  safe_sprintf<256ul>(&format_str,"{0:.{%u",0xffffffffffffffff);
  increment(format_str + 5);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[256],int>(&local_148,(v5 *)format_str,(char (*) [256])local_558,in_RCX);
      std::__cxx11::string::~string((string *)&local_148);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4d6;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4d6,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  sVar2 = strlen(format_str);
  (format_str + sVar2)[0] = '}';
  (format_str + sVar2)[1] = '\0';
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[256],int>(&local_168,(v5 *)format_str,(char (*) [256])local_558,piVar3);
      std::__cxx11::string::~string((string *)&local_168);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4da;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4da,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  (format_str + sVar2 + 1)[0] = '}';
  (format_str + sVar2 + 1)[1] = '\0';
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[256],int>(&local_188,(v5 *)format_str,(char (*) [256])local_558,piVar3);
      std::__cxx11::string::~string((string *)&local_188);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(format_str, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4dd;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4dd,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format string",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[6],int>(&local_1a8,(v5 *)"{0:.{",(char (*) [6])local_558,piVar3);
      std::__cxx11::string::~string((string *)&local_1a8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [100])
               "Expected: format(\"{0:.{\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4e0;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e0,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,
               "cannot switch from manual to automatic argument indexing",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[7],int>(&local_1c8,(v5 *)"{0:.{}",(char (*) [7])local_558,piVar3);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [101])
               "Expected: format(\"{0:.{}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4e2;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e2,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format string",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[9],int>(&local_1e8,(v5 *)"{0:.{?}}",(char (*) [9])local_558,piVar3);
      std::__cxx11::string::~string((string *)&local_1e8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(\"{0:.{?}}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e4,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      local_50c._0_4_ = 0;
      fmt::v5::format<char[8],int,int>
                (&local_208,(v5 *)"{0:.{1}",(char (*) [8])local_558,(int *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_208);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [105])
               "Expected: format(\"{0:.{1}\", 0, 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4e6;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e6,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"argument index out of range",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[9],int>(&local_228,(v5 *)"{0:.{1}}",(char (*) [9])local_558,piVar3);
      std::__cxx11::string::~string((string *)&local_228);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [103])
               "Expected: format(\"{0:.{1}}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  piVar3 = (int *)0x4e8;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4e8,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format string",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[10],int>(&local_248,(v5 *)"{0:.{0:}}",(char (*) [10])local_558,piVar3);
      std::__cxx11::string::~string((string *)&local_248);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:.{0:}}\", 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4eb,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"negative precision",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      local_50c._0_4_ = 0xffffffff;
      fmt::v5::format<char[9],int,int>
                (&local_268,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(int *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_268);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [107])
               "Expected: format(\"{0:.{1}}\", 0, -1) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    args_1 = (uint *)0x1f94d9;
  }
  else {
    args_1 = (uint *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4ee,(char *)args_1);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      local_50c._0_4_ = 0x80000000;
      fmt::v5::format<char[9],int,unsigned_int>
                (&local_288,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(int *)local_50c,args_1);
      std::__cxx11::string::~string((string *)&local_288);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [122])
               "Expected: format(\"{0:.{1}}\", 0, (2147483647 + 1u)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    plVar4 = (long *)0x1f94d9;
  }
  else {
    plVar4 = (long *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4f0,(char *)plVar4);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"negative precision",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_50c._0_4_ = 0;
      local_558[0] = -1;
      local_558[1] = -1;
      local_558[2] = -1;
      local_558[3] = -1;
      local_558[4] = -1;
      local_558[5] = -1;
      local_558[6] = -1;
      local_558[7] = -1;
      fmt::v5::format<char[9],int,long>
                (&local_2a8,(v5 *)"{0:.{1}}",(char (*) [9])local_50c,(int *)local_558,plVar4);
      std::__cxx11::string::~string((string *)&local_2a8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 0, -1l) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    plVar4 = (long *)0x1f94d9;
  }
  else {
    plVar4 = (long *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4f2,(char *)plVar4);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_50c._0_4_ = 0;
      local_558[0] = '\0';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = -0x80;
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      fmt::v5::format<char[9],int,long>
                (&local_2c8,(v5 *)"{0:.{1}}",(char (*) [9])local_50c,(int *)local_558,plVar4);
      std::__cxx11::string::~string((string *)&local_2c8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [116])
               "Expected: format(\"{0:.{1}}\", 0, (value + 1)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    args_1_00 = (unsigned_long *)0x1f94d9;
  }
  else {
    args_1_00 = (unsigned_long *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4f6,(char *)args_1_00);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"number is too big",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_50c._0_4_ = 0;
      local_558[0] = '\0';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = -0x80;
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      fmt::v5::format<char[9],int,unsigned_long>
                (&local_2e8,(v5 *)"{0:.{1}}",(char (*) [9])local_50c,(int *)local_558,args_1_00);
      std::__cxx11::string::~string((string *)&local_2e8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [123])
               "Expected: format(\"{0:.{1}}\", 0, (2147483647 + 1ul)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar5 = "";
  }
  else {
    pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4f9,pcVar5);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision is not integer",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      local_50c[0] = '0';
      fmt::v5::format<char[9],int,char>
                (&local_308,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(int *)local_50c,pcVar5);
      std::__cxx11::string::~string((string *)&local_308);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 0, \'0\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    args_1_01 = (double *)0x1f94d9;
  }
  else {
    args_1_01 = (double *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4fc,(char *)args_1_01);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision is not integer",(allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_50c._0_4_ = 0;
      _local_558 = (char  [10])((unkuint10)uStack_550 << 0x40);
      fmt::v5::format<char[9],int,double>
                (&local_328,(v5 *)"{0:.{1}}",(char (*) [9])local_50c,(int *)local_558,args_1_01);
      std::__cxx11::string::~string((string *)&local_328);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 0, 0.0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x4fe,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[9],int,int>
                (&local_348,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(int *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_348);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [107])
               "Expected: format(\"{0:.{1}}\", 42, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x501,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[10],int,int>
                (&local_368,(v5 *)"{0:.{1}f}",(char (*) [10])local_558,(int *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_368);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [108])
               "Expected: format(\"{0:.{1}f}\", 42, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x503,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[9],unsigned_int,int>
                (&local_388,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(uint *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_388);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 42u, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x505,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[10],unsigned_int,int>
                (&local_3a8,(v5 *)"{0:.{1}f}",(char (*) [10])local_558,(uint *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_3a8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [109])
               "Expected: format(\"{0:.{1}f}\", 42u, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x507,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[9],long,int>
                (&local_3c8,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(long *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_3c8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [108])
               "Expected: format(\"{0:.{1}}\", 42l, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x509,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[10],long,int>
                (&local_3e8,(v5 *)"{0:.{1}f}",(char (*) [10])local_558,(long *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_3e8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [109])
               "Expected: format(\"{0:.{1}f}\", 42l, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x50b,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[9],unsigned_long,int>
                (&local_408,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(unsigned_long *)local_50c,
                 piVar3);
      std::__cxx11::string::~string((string *)&local_408);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [109])
               "Expected: format(\"{0:.{1}}\", 42ul, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x50d,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[10],unsigned_long,int>
                (&local_428,(v5 *)"{0:.{1}f}",(char (*) [10])local_558,(unsigned_long *)local_50c,
                 piVar3);
      std::__cxx11::string::~string((string *)&local_428);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [110])
               "Expected: format(\"{0:.{1}f}\", 42ul, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x50f,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[9],long_long,int>
                (&local_448,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(longlong *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_448);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [109])
               "Expected: format(\"{0:.{1}}\", 42ll, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x511,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[10],long_long,int>
                (&local_468,(v5 *)"{0:.{1}f}",(char (*) [10])local_558,(longlong *)local_50c,piVar3)
      ;
      std::__cxx11::string::~string((string *)&local_468);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [110])
               "Expected: format(\"{0:.{1}f}\", 42ll, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x513,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[9],unsigned_long_long,int>
                (&local_488,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(unsigned_long_long *)local_50c
                 ,piVar3);
      std::__cxx11::string::~string((string *)&local_488);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [110])
               "Expected: format(\"{0:.{1}}\", 42ull, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x515,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = '*';
      local_558[1] = '\0';
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[10],unsigned_long_long,int>
                (&local_4a8,(v5 *)"{0:.{1}f}",(char (*) [10])local_558,
                 (unsigned_long_long *)local_50c,piVar3);
      std::__cxx11::string::~string((string *)&local_4a8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [111])
               "Expected: format(\"{0:.{1}f}\", 42ull, 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x517,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_50c[0] = 'x';
      _local_558 = (char  [10])((unkuint10)stack0xfffffffffffffaac << 0x20);
      fmt::v5::format<char[10],char,int>
                (&local_4c8,(v5 *)"{0:3.{1}}",(char (*) [10])local_50c,local_558,piVar3);
      std::__cxx11::string::~string((string *)&local_4c8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [109])
               "Expected: format(\"{0:3.{1}}\", \'x\', 0) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x519,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_558[0] = -0x73;
  local_558[1] = -0x69;
  local_558[2] = 'n';
  local_558[3] = '\x12';
  local_558[4] = -0x7d;
  local_558[5] = -0x40;
  local_558[6] = -0xd;
  local_558[7] = '?';
  local_50c._0_4_ = 2;
  __return_storage_ptr__ = &gtest_expected_message;
  fmt::v5::format<char[9],double,int>
            (__return_storage_ptr__,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(double *)local_50c,
             piVar3);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1.2\"","format(\"{0:.{1}}\", 1.2345, 2)",
             (char (*) [4])0x1f167d,__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x51a,(char *)__return_storage_ptr__);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_50c._0_4_ = 2;
  local_558[0] = DAT_001e4070;
  local_558[1] = UNK_001e4071;
  local_558[2] = UNK_001e4072;
  local_558[3] = UNK_001e4073;
  local_558[4] = UNK_001e4074;
  local_558[5] = UNK_001e4075;
  local_558[6] = UNK_001e4076;
  local_558[7] = UNK_001e4077;
  uStack_550._0_1_ = UNK_001e4078;
  uStack_550._1_1_ = UNK_001e4079;
  __return_storage_ptr___00 = &gtest_expected_message;
  fmt::v5::format<char[9],int,long_double>
            (__return_storage_ptr___00,(v5 *)"{1:.{0}}",(char (*) [9])local_50c,(int *)local_558,
             (longdouble *)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"1.2\"","format(\"{1:.{0}}\", 2, 1.2345l)",
             (char (*) [4])0x1f167d,__return_storage_ptr___00);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1f94d9;
    }
    else {
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x51b,(char *)__return_storage_ptr___00);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = -2;
      local_558[1] = -0x36;
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[9],void*,int>
                (&local_4e8,(v5 *)"{0:.{1}}",(char (*) [9])local_558,(void **)local_50c,
                 (int *)__return_storage_ptr___00);
      std::__cxx11::string::~string((string *)&local_4e8);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [136])
               "Expected: format(\"{0:.{1}}\", reinterpret_cast<void*>(0xcafe), 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x51e,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"precision not allowed for this argument type",
               (allocator *)local_558);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_558[0] = -2;
      local_558[1] = -0x36;
      local_558[2] = '\0';
      local_558[3] = '\0';
      local_558[4] = '\0';
      local_558[5] = '\0';
      local_558[6] = '\0';
      local_558[7] = '\0';
      local_50c._0_4_ = 2;
      fmt::v5::format<char[10],void*,int>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_50c + 4),(v5 *)"{0:.{1}f}",(char (*) [10])local_558,(void **)local_50c,
                 piVar3);
      std::__cxx11::string::~string((string *)(local_50c + 4));
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [137])
               "Expected: format(\"{0:.{1}f}\", reinterpret_cast<void*>(0xcafe), 2) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    piVar3 = (int *)0x1f94d9;
  }
  else {
    piVar3 = (int *)((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_558,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x520,(char *)piVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_558[0] = '\x02';
  local_558[1] = '\0';
  local_558[2] = '\0';
  local_558[3] = '\0';
  fmt::v5::format<char[9],char[4],int>
            (&gtest_expected_message,(v5 *)"{0:.{1}}",(char (*) [9])"str",(char (*) [4])local_558,
             piVar3);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"st\"","format(\"{0:.{1}}\", \"str\", 2)",
             (char (*) [3])0x1e4792,&gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x522,pcVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_558,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_558);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, RuntimePrecision) {
  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{0:.{%u", UINT_MAX);
  increment(format_str + 5);
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  std::size_t size = std::strlen(format_str);
  format_str[size] = '}';
  format_str[size + 1] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");
  format_str[size + 1] = '}';
  format_str[size + 2] = 0;
  EXPECT_THROW_MSG(format(format_str, 0), format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.{", 0),
      format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0:.{}", 0),
      format_error, "cannot switch from manual to automatic argument indexing");
  EXPECT_THROW_MSG(format("{0:.{?}}", 0),
      format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0:.{1}", 0, 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0),
      format_error, "argument index out of range");

  EXPECT_THROW_MSG(format("{0:.{0:}}", 0),
      format_error, "invalid format string");

  EXPECT_THROW_MSG(format("{0:.{1}}", 0, -1),
      format_error, "negative precision");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, (INT_MAX + 1u)),
      format_error, "number is too big");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, -1l),
      format_error, "negative precision");
  if (fmt::internal::const_check(sizeof(long) > sizeof(int))) {
    long value = INT_MAX;
    EXPECT_THROW_MSG(format("{0:.{1}}", 0, (value + 1)),
        format_error, "number is too big");
  }
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, (INT_MAX + 1ul)),
      format_error, "number is too big");

  EXPECT_THROW_MSG(format("{0:.{1}}", 0, '0'),
      format_error, "precision is not integer");
  EXPECT_THROW_MSG(format("{0:.{1}}", 0, 0.0),
      format_error, "precision is not integer");

  EXPECT_THROW_MSG(format("{0:.{1}}", 42, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42u, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42u, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42l, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42l, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ul, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ul, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ll, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ll, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}}", 42ull, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", 42ull, 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:3.{1}}", 'x', 0),
      format_error, "precision not allowed for this argument type");
  EXPECT_EQ("1.2", format("{0:.{1}}", 1.2345, 2));
  EXPECT_EQ("1.2", format("{1:.{0}}", 2, 1.2345l));

  EXPECT_THROW_MSG(format("{0:.{1}}", reinterpret_cast<void*>(0xcafe), 2),
      format_error, "precision not allowed for this argument type");
  EXPECT_THROW_MSG(format("{0:.{1}f}", reinterpret_cast<void*>(0xcafe), 2),
      format_error, "precision not allowed for this argument type");

  EXPECT_EQ("st", format("{0:.{1}}", "str", 2));
}